

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O2

void __thiscall
sjtu::LRUCache<sjtu::trainType>::CacheNode::CacheNode
          (CacheNode *this,trainType *value_,locType *offset_,LRUCache<sjtu::trainType> *bel_)

{
  value_type local_40;
  pair<sjtu::map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_>::iterator,_bool>
  local_30;
  
  trainType::trainType(&this->value,value_);
  local_40.first = *offset_;
  this->offset = local_40.first;
  this->is_dirty_page = false;
  this->prec = (CacheNode *)0x0;
  this->succ = (CacheNode *)0x0;
  this->bel = bel_;
  local_40.second = this;
  map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_>::insert
            (&local_30,&bel_->table,&local_40);
  return;
}

Assistant:

CacheNode(const valueType &value_ , const locType &offset_ , LRUCache<valueType> *bel_) : value(value_) , offset(offset_) , bel(bel_) , is_dirty_page(false) , prec(nullptr) , succ(nullptr)
			{
				bel -> table.insert(std::make_pair(offset , this));
			}